

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

mir_size_t get_object_path_offset(c2m_ctx_t c2m_ctx)

{
  void *pvVar1;
  anon_union_8_2_e4b0c9a5_for_u aVar2;
  size_t sVar3;
  mir_size_t mVar4;
  mir_size_t mVar5;
  ulong ix;
  init_object_t local_40;
  
  mVar5 = 0;
  ix = 0;
  do {
    sVar3 = VARR_init_object_tlength(c2m_ctx->init_object_path);
    if (sVar3 <= ix) {
      return mVar5;
    }
    VARR_init_object_tget(&local_40,c2m_ctx->init_object_path,ix);
    aVar2 = local_40.u;
    if ((local_40.container_type)->mode - TM_STRUCT < 2) {
      if ((local_40.u.curr_member)->code != N_MEMBER) {
        __assert_fail("init_object.u.curr_member->code == N_MEMBER",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2cab,"mir_size_t get_object_path_offset(c2m_ctx_t)");
      }
      pvVar1 = (local_40.u.curr_member)->attr;
      if ((pvVar1 == (void *)0x0) || (*(char *)(*(long *)((long)pvVar1 + 0x40) + 0x1d) == '\0')) {
        mVar5 = mVar5 + *(long *)((long)pvVar1 + 0x10);
      }
    }
    else {
      if ((local_40.container_type)->mode != TM_ARR) {
        __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2caa,"mir_size_t get_object_path_offset(c2m_ctx_t)");
      }
      mVar4 = type_size(c2m_ctx,(((local_40.container_type)->u).ptr_type)->arr_type);
      mVar5 = mVar5 + mVar4 * aVar2.curr_index;
    }
    ix = ix + 1;
  } while( true );
}

Assistant:

static mir_size_t get_object_path_offset (c2m_ctx_t c2m_ctx) {
  init_object_t init_object;
  size_t offset = 0;

  for (size_t i = 0; i < VARR_LENGTH (init_object_t, init_object_path); i++) {
    init_object = VARR_GET (init_object_t, init_object_path, i);
    if (init_object.container_type->mode == TM_ARR) {  // ??? index < 0
      offset += (init_object.u.curr_index
                 * type_size (c2m_ctx, init_object.container_type->u.arr_type->el_type));
    } else {
      assert (init_object.container_type->mode == TM_STRUCT
              || init_object.container_type->mode == TM_UNION);
      assert (init_object.u.curr_member->code == N_MEMBER);
      if (!anon_struct_union_type_member_p (init_object.u.curr_member))
        /* Members inside anon struct/union already have adjusted offset */
        offset += ((decl_t) init_object.u.curr_member->attr)->offset;
    }
  }
  return offset;
}